

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charpoly.h
# Opt level: O2

void charpoly_danilevsky_piv<Eigen::Matrix<double,11,11,0,11,11>>
               (MatrixBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>_> *A,double *p)

{
  ulong row;
  ulong col;
  Scalar *pSVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long col_00;
  int j;
  ulong col_01;
  ulong uVar4;
  ulong local_190;
  double piv;
  Scalar *local_178;
  long local_170;
  ulong local_168;
  VectorXd *local_160;
  VectorXd Acol;
  VectorXd vinv;
  VectorXd v;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,_11,_11,_0,_11,_11>,_0>
  local_128;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_f8 [6];
  Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false> local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_98;
  
  local_190 = 9;
  uVar4 = 0xb;
  local_178 = p;
  while (1 < uVar4) {
    row = uVar4 - 1;
    col = uVar4 - 2;
    local_168 = uVar4;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,row,col);
    piv = ABS(*pSVar1);
    uVar4 = col & 0xffffffff;
    for (col_01 = 0; local_190 != col_01; col_01 = col_01 + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,row,
                          col_01);
      if (piv < ABS(*pSVar1)) {
        pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,row,
                            col_01);
        piv = ABS(*pSVar1);
        uVar4 = col_01 & 0xffffffff;
      }
    }
    if ((int)uVar4 != (int)col) {
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
                (&local_98.m_lhs,(Matrix<double,_11,_11,_0,_11,_11> *)A,col);
      local_170 = (long)(int)uVar4;
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
                ((Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false> *)&local_128,
                 (Matrix<double,_11,_11,_0,_11,_11> *)A,local_170);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>::
      swap<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>> *)
                 &local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>_> *
                 )&local_128);
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true> *)&local_98,
                 (Matrix<double,_11,_11,_0,_11,_11> *)A,col);
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>::Block
                ((Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true> *)&local_128,
                 (Matrix<double,_11,_11,_0,_11,_11> *)A,local_170);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>::
      swap<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>> *)&local_98
                 ,(DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>_> *
                  )&local_128);
    }
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,row,col);
    piv = *pSVar1;
    Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
              (&local_98.m_lhs,(Matrix<double,_11,_11,_0,_11,_11> *)A,row);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>_> *)
               &local_98);
    local_f8[0] = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&v;
    local_128 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>> *)
                           local_f8,A);
    Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
              (&local_98.m_lhs,(Matrix<double,_11,_11,_0,_11,_11> *)A,col);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Matrix<double,11,11,0,11,11>,0>>
              (&local_98.m_lhs,&local_128);
    local_128.m_lhs.m_matrix = (non_const_type)0xbff0000000000000;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&local_98,(double *)&local_128,(StorageBaseType *)&v);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&vinv,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_98);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vinv,col);
    *pSVar2 = 1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vinv,&piv);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vinv,col);
    *pSVar2 = *pSVar2 + -1.0;
    Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>::Block
              ((Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true> *)&local_98,
               (Matrix<double,_11,_11,_0,_11,_11> *)A,col);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,11,1,true>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Acol,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_11,_1,_true>_> *)
               &local_98);
    for (uVar4 = 0; local_168 != uVar4; uVar4 = uVar4 + 1) {
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
                ((Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false> *)&local_128,
                 (Matrix<double,_11,_11,_0,_11,_11> *)A,uVar4);
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&Acol,uVar4)
      ;
      local_160 = &vinv;
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_f8,pSVar2,(StorageBaseType *)&local_160);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>>::operator+
                (&local_98,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>> *)
                 &local_128,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_f8);
      Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
                (&local_c8,(Matrix<double,_11,_11,_0,_11,_11> *)A,uVar4);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>const>const>>
                (&local_c8,&local_98);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
              ((ConstantReturnType *)&local_128,0xb);
    Eigen::Block<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1,_11,_false>::Block
              (&local_98.m_lhs,(Matrix<double,_11,_11,_0,_11,_11> *)A,row);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,11,11,0,11,11>,1,11,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&local_98.m_lhs,(ConstantReturnType *)&local_128);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,row,col);
    *pSVar1 = 1.0;
    free(Acol.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(vinv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    local_190 = (ulong)((int)local_190 - 1);
    uVar4 = row;
  }
  local_178[0xb] = 1.0;
  pSVar1 = local_178;
  for (col_00 = 10; col_00 != -1; col_00 = col_00 + -1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_11,_11,_0,_11,_11>,_1> *)A,0,col_00);
    *pSVar1 = -*pSVar3;
    pSVar1 = pSVar1 + 1;
  }
  return;
}

Assistant:

void charpoly_danilevsky_piv(Eigen::MatrixBase<Derived> &A, double *p) {
	int n = A.rows();

	for (int i = n - 1; i > 0; i--) {

		int piv_ind = i - 1;
		double piv = std::abs(A(i, i - 1));

		// Find largest pivot
		for (int j = 0; j < i - 1; j++) {
			if (std::abs(A(i, j)) > piv) {
				piv = std::abs(A(i, j));
				piv_ind = j;
			}
		}
		if (piv_ind != i - 1) {
			// Perform permutation
			A.row(i - 1).swap(A.row(piv_ind));
			A.col(i - 1).swap(A.col(piv_ind));
		}
		piv = A(i, i - 1);

		Eigen::VectorXd v = A.row(i);
		A.row(i - 1) = v.transpose()*A;

		Eigen::VectorXd vinv = (-1.0)*v;
		vinv(i - 1) = 1;
		vinv /= piv;
		vinv(i - 1) -= 1;
		Eigen::VectorXd Acol = A.col(i - 1);
		for (int j = 0; j <= i; j++)
			A.row(j) = A.row(j) + Acol(j)*vinv.transpose();


		A.row(i) = Eigen::VectorXd::Zero(n);
		A(i, i - 1) = 1;
	}
	p[n] = 1;
	for (int i = 0; i < n; i++)
		p[i] = -A(0, n - i - 1);
}